

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tinyexr.h
# Opt level: O0

mz_bool mz_zip_reader_extract_to_mem_no_alloc
                  (mz_zip_archive *pZip,mz_uint file_index,void *pBuf,size_t buf_size,mz_uint flags,
                  void *pUser_read_buf,size_t user_read_buf_size)

{
  mz_bool mVar1;
  size_t sVar2;
  mz_ulong mVar3;
  long lVar4;
  ulong in_RCX;
  mz_uint8 *in_RDX;
  mz_uint in_ESI;
  mz_zip_archive *in_RDI;
  uint in_R8D;
  void *in_R9;
  size_t in_stack_00000008;
  size_t out_buf_size;
  size_t in_buf_size;
  tinfl_decompressor inflator;
  mz_uint8 *pLocal_header;
  mz_uint32 local_header_u32 [8];
  void *pRead_buf;
  mz_zip_archive_file_stat file_stat;
  mz_uint64 read_buf_avail;
  mz_uint64 read_buf_ofs;
  mz_uint64 read_buf_size;
  mz_uint64 out_buf_ofs;
  mz_uint64 comp_remaining;
  mz_uint64 cur_file_ofs;
  mz_uint64 needed_size;
  int status;
  mz_zip_archive_file_stat *in_stack_ffffffffffffd1e8;
  undefined8 in_stack_ffffffffffffd1f0;
  undefined7 in_stack_ffffffffffffd1f8;
  undefined1 in_stack_ffffffffffffd1ff;
  bool bVar5;
  ulong local_2e00;
  size_t *in_stack_ffffffffffffd440;
  mz_uint8 *in_stack_ffffffffffffd448;
  mz_uint8 *in_stack_ffffffffffffd450;
  size_t *in_stack_ffffffffffffd458;
  mz_uint8 *in_stack_ffffffffffffd460;
  tinfl_decompressor *in_stack_ffffffffffffd468;
  mz_uint32 in_stack_ffffffffffffd480;
  int local_2e8 [6];
  ushort local_2ce;
  ushort local_2cc;
  void *local_2c8;
  ushort local_2b4;
  short local_2b2;
  uint local_2a8;
  ulong local_2a0;
  ulong local_298;
  mz_uint64 local_288;
  size_t local_78;
  long local_70;
  ulong local_68;
  size_t local_60;
  ulong local_58;
  mz_uint64 local_50;
  ulong local_48;
  tinfl_status local_3c;
  void *local_38;
  uint local_2c;
  ulong local_28;
  mz_uint8 *local_20;
  mz_uint local_14;
  mz_zip_archive *local_10;
  uint local_4;
  
  local_3c = TINFL_STATUS_DONE;
  local_60 = 0;
  local_70 = 0;
  if ((in_RCX == 0) || (in_RDX != (mz_uint8 *)0x0)) {
    local_38 = in_R9;
    local_2c = in_R8D;
    local_28 = in_RCX;
    local_20 = in_RDX;
    local_14 = in_ESI;
    local_10 = in_RDI;
    mVar1 = mz_zip_reader_file_stat
                      ((mz_zip_archive *)
                       CONCAT17(in_stack_ffffffffffffd1ff,in_stack_ffffffffffffd1f8),
                       (mz_uint)((ulong)in_stack_ffffffffffffd1f0 >> 0x20),in_stack_ffffffffffffd1e8
                      );
    if (mVar1 == 0) {
      local_4 = 0;
    }
    else if (local_2a0 == 0) {
      local_4 = 1;
    }
    else {
      mVar1 = mz_zip_reader_is_file_a_directory(local_10,local_14);
      if (mVar1 == 0) {
        if ((local_2b4 & 0x21) == 0) {
          if ((((local_2c & 0x400) == 0) && (local_2b2 != 0)) && (local_2b2 != 8)) {
            local_4 = 0;
          }
          else {
            if ((local_2c & 0x400) == 0) {
              local_2e00 = local_298;
            }
            else {
              local_2e00 = local_2a0;
            }
            local_48 = local_2e00;
            if (local_28 < local_2e00) {
              local_4 = 0;
            }
            else {
              local_50 = local_288;
              sVar2 = (*local_10->m_pRead)(local_10->m_pIO_opaque,local_288,local_2e8,0x1e);
              if (sVar2 == 0x1e) {
                if (local_2e8[0] == 0x4034b50) {
                  local_50 = (local_2ce + 0x1e + (uint)local_2cc) + local_50;
                  if (local_10->m_archive_size < local_50 + local_2a0) {
                    local_4 = 0;
                  }
                  else if (((local_2c & 0x400) == 0) && (local_2b2 != 0)) {
                    if (local_10->m_pState->m_pMem == (void *)0x0) {
                      if (local_38 == (void *)0x0) {
                        local_68 = local_2a0;
                        if (0xffff < local_2a0) {
                          local_68 = 0x10000;
                        }
                        local_2c8 = (*local_10->m_pAlloc)(local_10->m_pAlloc_opaque,1,local_68);
                        if (local_2c8 == (void *)0x0) {
                          return 0;
                        }
                        local_58 = local_2a0;
                      }
                      else {
                        if (in_stack_00000008 == 0) {
                          return 0;
                        }
                        local_2c8 = local_38;
                        local_68 = in_stack_00000008;
                        local_58 = local_2a0;
                      }
                      local_78 = 0;
                    }
                    else {
                      local_2c8 = (void *)((long)local_10->m_pState->m_pMem + local_50);
                      local_78 = local_2a0;
                      local_68 = local_2a0;
                      local_58 = 0;
                    }
                    do {
                      lVar4 = local_298 - local_60;
                      if ((local_78 == 0) && (local_10->m_pState->m_pMem == (void *)0x0)) {
                        local_78 = local_58;
                        if (local_68 < local_58) {
                          local_78 = local_68;
                        }
                        sVar2 = (*local_10->m_pRead)
                                          (local_10->m_pIO_opaque,local_50,local_2c8,local_78);
                        if (sVar2 != local_78) {
                          local_3c = TINFL_STATUS_FAILED;
                          break;
                        }
                        local_50 = local_78 + local_50;
                        local_58 = local_58 - local_78;
                        local_70 = 0;
                      }
                      sVar2 = local_78;
                      local_3c = tinfl_decompress(in_stack_ffffffffffffd468,
                                                  in_stack_ffffffffffffd460,
                                                  in_stack_ffffffffffffd458,
                                                  in_stack_ffffffffffffd450,
                                                  in_stack_ffffffffffffd448,
                                                  in_stack_ffffffffffffd440,
                                                  in_stack_ffffffffffffd480);
                      local_78 = local_78 - sVar2;
                      local_70 = sVar2 + local_70;
                      local_60 = lVar4 + local_60;
                    } while (local_3c == TINFL_STATUS_NEEDS_MORE_INPUT);
                    if ((local_3c == TINFL_STATUS_DONE) &&
                       ((local_60 != local_298 ||
                        (mVar3 = mz_crc32(0,local_20,local_298), mVar3 != local_2a8)))) {
                      local_3c = TINFL_STATUS_FAILED;
                    }
                    if ((local_10->m_pState->m_pMem == (void *)0x0) && (local_38 == (void *)0x0)) {
                      (*local_10->m_pFree)(local_10->m_pAlloc_opaque,local_2c8);
                    }
                    local_4 = (uint)(local_3c == TINFL_STATUS_DONE);
                  }
                  else {
                    sVar2 = (*local_10->m_pRead)(local_10->m_pIO_opaque,local_50,local_20,local_48);
                    if (sVar2 == local_48) {
                      bVar5 = true;
                      if ((local_2c & 0x400) == 0) {
                        mVar3 = mz_crc32(0,local_20,local_298);
                        bVar5 = mVar3 == local_2a8;
                      }
                      local_4 = (uint)bVar5;
                    }
                    else {
                      local_4 = 0;
                    }
                  }
                }
                else {
                  local_4 = 0;
                }
              }
              else {
                local_4 = 0;
              }
            }
          }
        }
        else {
          local_4 = 0;
        }
      }
      else {
        local_4 = 1;
      }
    }
  }
  else {
    local_4 = 0;
  }
  return local_4;
}

Assistant:

mz_bool mz_zip_reader_extract_to_mem_no_alloc(mz_zip_archive *pZip,
                                              mz_uint file_index, void *pBuf,
                                              size_t buf_size, mz_uint flags,
                                              void *pUser_read_buf,
                                              size_t user_read_buf_size) {
  int status = TINFL_STATUS_DONE;
  mz_uint64 needed_size, cur_file_ofs, comp_remaining,
      out_buf_ofs = 0, read_buf_size, read_buf_ofs = 0, read_buf_avail;
  mz_zip_archive_file_stat file_stat;
  void *pRead_buf;
  mz_uint32
      local_header_u32[(MZ_ZIP_LOCAL_DIR_HEADER_SIZE + sizeof(mz_uint32) - 1) /
                       sizeof(mz_uint32)];
  mz_uint8 *pLocal_header = (mz_uint8 *)local_header_u32;
  tinfl_decompressor inflator;

  if ((buf_size) && (!pBuf))
    return MZ_FALSE;

  if (!mz_zip_reader_file_stat(pZip, file_index, &file_stat))
    return MZ_FALSE;

  // Empty file, or a directory (but not always a directory - I've seen odd zips
  // with directories that have compressed data which inflates to 0 bytes)
  if (!file_stat.m_comp_size)
    return MZ_TRUE;

  // Entry is a subdirectory (I've seen old zips with dir entries which have
  // compressed deflate data which inflates to 0 bytes, but these entries claim
  // to uncompress to 512 bytes in the headers).
  // I'm torn how to handle this case - should it fail instead?
  if (mz_zip_reader_is_file_a_directory(pZip, file_index))
    return MZ_TRUE;

  // Encryption and patch files are not supported.
  if (file_stat.m_bit_flag & (1 | 32))
    return MZ_FALSE;

  // This function only supports stored and deflate.
  if ((!(flags & MZ_ZIP_FLAG_COMPRESSED_DATA)) && (file_stat.m_method != 0) &&
      (file_stat.m_method != MZ_DEFLATED))
    return MZ_FALSE;

  // Ensure supplied output buffer is large enough.
  needed_size = (flags & MZ_ZIP_FLAG_COMPRESSED_DATA) ? file_stat.m_comp_size
                                                      : file_stat.m_uncomp_size;
  if (buf_size < needed_size)
    return MZ_FALSE;

  // Read and parse the local directory entry.
  cur_file_ofs = file_stat.m_local_header_ofs;
  if (pZip->m_pRead(pZip->m_pIO_opaque, cur_file_ofs, pLocal_header,
                    MZ_ZIP_LOCAL_DIR_HEADER_SIZE) !=
      MZ_ZIP_LOCAL_DIR_HEADER_SIZE)
    return MZ_FALSE;
  if (MZ_READ_LE32(pLocal_header) != MZ_ZIP_LOCAL_DIR_HEADER_SIG)
    return MZ_FALSE;

  cur_file_ofs += MZ_ZIP_LOCAL_DIR_HEADER_SIZE +
                  MZ_READ_LE16(pLocal_header + MZ_ZIP_LDH_FILENAME_LEN_OFS) +
                  MZ_READ_LE16(pLocal_header + MZ_ZIP_LDH_EXTRA_LEN_OFS);
  if ((cur_file_ofs + file_stat.m_comp_size) > pZip->m_archive_size)
    return MZ_FALSE;

  if ((flags & MZ_ZIP_FLAG_COMPRESSED_DATA) || (!file_stat.m_method)) {
    // The file is stored or the caller has requested the compressed data.
    if (pZip->m_pRead(pZip->m_pIO_opaque, cur_file_ofs, pBuf,
                      (size_t)needed_size) != needed_size)
      return MZ_FALSE;
    return ((flags & MZ_ZIP_FLAG_COMPRESSED_DATA) != 0) ||
           (mz_crc32(MZ_CRC32_INIT, (const mz_uint8 *)pBuf,
                     (size_t)file_stat.m_uncomp_size) == file_stat.m_crc32);
  }

  // Decompress the file either directly from memory or from a file input
  // buffer.
  tinfl_init(&inflator);

  if (pZip->m_pState->m_pMem) {
    // Read directly from the archive in memory.
    pRead_buf = (mz_uint8 *)pZip->m_pState->m_pMem + cur_file_ofs;
    read_buf_size = read_buf_avail = file_stat.m_comp_size;
    comp_remaining = 0;
  } else if (pUser_read_buf) {
    // Use a user provided read buffer.
    if (!user_read_buf_size)
      return MZ_FALSE;
    pRead_buf = (mz_uint8 *)pUser_read_buf;
    read_buf_size = user_read_buf_size;
    read_buf_avail = 0;
    comp_remaining = file_stat.m_comp_size;
  } else {
    // Temporarily allocate a read buffer.
    read_buf_size = MZ_MIN(file_stat.m_comp_size, MZ_ZIP_MAX_IO_BUF_SIZE);
#ifdef _MSC_VER
    if (((0, sizeof(size_t) == sizeof(mz_uint32))) &&
        (read_buf_size > 0x7FFFFFFF))
#else
    if (((sizeof(size_t) == sizeof(mz_uint32))) && (read_buf_size > 0x7FFFFFFF))
#endif
      return MZ_FALSE;
    if (NULL == (pRead_buf = pZip->m_pAlloc(pZip->m_pAlloc_opaque, 1,
                                            (size_t)read_buf_size)))
      return MZ_FALSE;
    read_buf_avail = 0;
    comp_remaining = file_stat.m_comp_size;
  }

  do {
    size_t in_buf_size,
        out_buf_size = (size_t)(file_stat.m_uncomp_size - out_buf_ofs);
    if ((!read_buf_avail) && (!pZip->m_pState->m_pMem)) {
      read_buf_avail = MZ_MIN(read_buf_size, comp_remaining);
      if (pZip->m_pRead(pZip->m_pIO_opaque, cur_file_ofs, pRead_buf,
                        (size_t)read_buf_avail) != read_buf_avail) {
        status = TINFL_STATUS_FAILED;
        break;
      }
      cur_file_ofs += read_buf_avail;
      comp_remaining -= read_buf_avail;
      read_buf_ofs = 0;
    }
    in_buf_size = (size_t)read_buf_avail;
    status = tinfl_decompress(
        &inflator, (mz_uint8 *)pRead_buf + read_buf_ofs, &in_buf_size,
        (mz_uint8 *)pBuf, (mz_uint8 *)pBuf + out_buf_ofs, &out_buf_size,
        TINFL_FLAG_USING_NON_WRAPPING_OUTPUT_BUF |
            (comp_remaining ? TINFL_FLAG_HAS_MORE_INPUT : 0));
    read_buf_avail -= in_buf_size;
    read_buf_ofs += in_buf_size;
    out_buf_ofs += out_buf_size;
  } while (status == TINFL_STATUS_NEEDS_MORE_INPUT);

  if (status == TINFL_STATUS_DONE) {
    // Make sure the entire file was decompressed, and check its CRC.
    if ((out_buf_ofs != file_stat.m_uncomp_size) ||
        (mz_crc32(MZ_CRC32_INIT, (const mz_uint8 *)pBuf,
                  (size_t)file_stat.m_uncomp_size) != file_stat.m_crc32))
      status = TINFL_STATUS_FAILED;
  }

  if ((!pZip->m_pState->m_pMem) && (!pUser_read_buf))
    pZip->m_pFree(pZip->m_pAlloc_opaque, pRead_buf);

  return status == TINFL_STATUS_DONE;
}